

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cc
# Opt level: O0

char * OpenSSL_version(int which)

{
  char *pcStack_10;
  int which_local;
  
  switch(which) {
  case 0:
    pcStack_10 = "BoringSSL";
    break;
  case 1:
    pcStack_10 = "compiler: n/a";
    break;
  case 2:
    pcStack_10 = "built on: n/a";
    break;
  case 3:
    pcStack_10 = "platform: n/a";
    break;
  case 4:
    pcStack_10 = "OPENSSLDIR: n/a";
    break;
  default:
    pcStack_10 = "not available";
  }
  return pcStack_10;
}

Assistant:

const char *OpenSSL_version(int which) {
  switch (which) {
    case OPENSSL_VERSION:
      return "BoringSSL";
    case OPENSSL_CFLAGS:
      return "compiler: n/a";
    case OPENSSL_BUILT_ON:
      return "built on: n/a";
    case OPENSSL_PLATFORM:
      return "platform: n/a";
    case OPENSSL_DIR:
      return "OPENSSLDIR: n/a";
    default:
      return "not available";
  }
}